

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

Am_Wrapper * get_undos_search_dialog_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Wrapper *pAVar2;
  Am_Object undo_handler;
  Am_Object search_window;
  Am_Object local_10;
  
  search_window.data = (Am_Object_Data *)0x0;
  Am_Object::Am_Object(&local_10,self);
  get_undo_handler(&undo_handler);
  Am_Object::~Am_Object(&local_10);
  bVar1 = Am_Object::Valid(&undo_handler);
  if (bVar1) {
    in_value = Am_Object::Get(&undo_handler,Am_SEARCH_DIALOG,1);
    Am_Object::operator=(&search_window,in_value);
  }
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&search_window);
  Am_Object::~Am_Object(&undo_handler);
  Am_Object::~Am_Object(&search_window);
  return pAVar2;
}

Assistant:

Am_Define_Object_Formula(get_undos_search_dialog)
{
  Am_Object search_window;
  Am_Object undo_handler = get_undo_handler(self);
  if (undo_handler.Valid()) {
    search_window = undo_handler.Peek(Am_SEARCH_DIALOG);
  }
  return search_window;
}